

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags.cc
# Opt level: O3

bool google::anon_unknown_1::TryParseLocked
               (CommandLineFlag *flag,FlagValue *flag_value,char *value,string *msg)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  bool bVar4;
  FlagValue *this;
  long lVar5;
  string local_48;
  
  uVar1._0_1_ = flag_value->type_;
  uVar1._1_1_ = flag_value->owns_value_;
  uVar1._2_2_ = *(undefined2 *)&flag_value->field_0xa;
  this = FlagValue::New((FlagValue *)(ulong)uVar1);
  bVar4 = FlagValue::ParseFrom(this,value);
  if (bVar4) {
    bVar4 = CommandLineFlag::Validate
                      ((CommandLineFlag *)flag->name_,(FlagValue *)flag->validate_fn_proto_);
    if (bVar4) {
      uVar2._0_1_ = flag_value->type_;
      uVar2._1_1_ = flag_value->owns_value_;
      uVar2._2_2_ = *(undefined2 *)&flag_value->field_0xa;
      FlagValue::CopyFrom((FlagValue *)flag_value->value_buffer_,(FlagValue *)(ulong)uVar2);
      if (msg != (string *)0x0) {
        pcVar3 = flag->name_;
        (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,flag_value->value_buffer_);
        StringAppendF(msg,"%s set to %s\n",pcVar3,local_48._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != &local_48.field_2) {
          operator_delete(local_48._M_dataplus._M_p);
        }
      }
      FlagValue::~FlagValue(this);
      operator_delete(this);
      return true;
    }
    if (msg != (string *)0x0) {
      (anonymous_namespace)::FlagValue::ToString_abi_cxx11_(&local_48,this->value_buffer_);
      StringAppendF(msg,"%sfailed validation of new value \'%s\' for flag \'%s\'\n","ERROR: ",
                    local_48._M_dataplus._M_p,flag->name_);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
    }
  }
  else if (msg != (string *)0x0) {
    lVar5 = (long)flag->defvalue_->type_;
    if (6 < lVar5) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/gflags/src/gflags.cc"
                    ,0x1a2,"const char *google::(anonymous namespace)::FlagValue::TypeName() const")
      ;
    }
    StringAppendF(msg,"%sillegal value \'%s\' specified for %s flag \'%s\'\n","ERROR: ",value,
                  &(anonymous_namespace)::FlagValue::TypeName()::types + lVar5 * 7,flag->name_);
  }
  FlagValue::~FlagValue(this);
  operator_delete(this);
  return false;
}

Assistant:

bool TryParseLocked(const CommandLineFlag* flag, FlagValue* flag_value,
                    const char* value, string* msg) {
  // Use tenative_value, not flag_value, until we know value is valid.
  FlagValue* tentative_value = flag_value->New();
  if (!tentative_value->ParseFrom(value)) {
    if (msg) {
      StringAppendF(msg,
                    "%sillegal value '%s' specified for %s flag '%s'\n",
                    kError, value,
                    flag->type_name(), flag->name());
    }
    delete tentative_value;
    return false;
  } else if (!flag->Validate(*tentative_value)) {
    if (msg) {
      StringAppendF(msg,
          "%sfailed validation of new value '%s' for flag '%s'\n",
          kError, tentative_value->ToString().c_str(),
          flag->name());
    }
    delete tentative_value;
    return false;
  } else {
    flag_value->CopyFrom(*tentative_value);
    if (msg) {
      StringAppendF(msg, "%s set to %s\n",
                    flag->name(), flag_value->ToString().c_str());
    }
    delete tentative_value;
    return true;
  }
}